

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_output_attributes
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  char_t cVar1;
  ulong uVar2;
  char *data;
  xml_attribute_struct *pxVar3;
  
  pxVar3 = node->first_attribute;
  if (pxVar3 != (xml_attribute_struct *)0x0) {
    cVar1 = ((flags >> 9 & 1) != 0) * '\x05' + '\"';
    do {
      if ((flags & 0x44) == 0x40) {
        uVar2 = writer->bufsize;
        if (0x7ff < uVar2) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar2);
          writer->bufsize = 0;
          uVar2 = 0;
        }
        writer->buffer[uVar2] = '\n';
        writer->bufsize = uVar2 + 1;
        text_output_indent(writer,indent,indent_length,depth + 1);
      }
      else {
        uVar2 = writer->bufsize;
        if (0x7ff < uVar2) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar2);
          writer->bufsize = 0;
          uVar2 = 0;
        }
        writer->buffer[uVar2] = ' ';
        writer->bufsize = uVar2 + 1;
      }
      data = (char *)pxVar3->name;
      if ((char_t *)data == (char_t *)0x0) {
        data = ":anonymous";
      }
      xml_buffered_writer::write_string(writer,(char_t *)data);
      uVar2 = writer->bufsize;
      if (0x7fe < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        writer->bufsize = 0;
        uVar2 = 0;
      }
      writer->buffer[uVar2] = '=';
      writer->buffer[uVar2 + 1] = cVar1;
      writer->bufsize = uVar2 + 2;
      if (pxVar3->value != (char_t *)0x0) {
        text_output(writer,pxVar3->value,ctx_special_attr,flags);
      }
      uVar2 = writer->bufsize;
      if (0x7ff < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        writer->bufsize = 0;
        uVar2 = 0;
      }
      writer->buffer[uVar2] = cVar1;
      writer->bufsize = uVar2 + 1;
      pxVar3 = pxVar3->next_attribute;
    } while (pxVar3 != (xml_attribute_struct *)0x0);
  }
  return;
}

Assistant:

PUGI__FN void node_output_attributes(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t enquotation_char = (flags & format_attribute_single_quote) ? '\'' : '"';

		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
		{
			if ((flags & (format_indent_attributes | format_raw)) == format_indent_attributes)
			{
				writer.write('\n');

				text_output_indent(writer, indent, indent_length, depth + 1);
			}
			else
			{
				writer.write(' ');
			}

			writer.write_string(a->name ? a->name + 0 : default_name);
			writer.write('=', enquotation_char);

			if (a->value)
				text_output(writer, a->value, ctx_special_attr, flags);

			writer.write(enquotation_char);
		}
	}